

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn_lex.cpp
# Opt level: O3

string * __thiscall util::Lexer::ReadToken_abi_cxx11_(string *__return_storage_ptr__,Lexer *this)

{
  char cVar1;
  _Elt_pointer pbVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  string *psVar7;
  char c;
  char local_59;
  string *local_58;
  code *local_50 [2];
  code *local_40;
  code *local_38;
  
  local_58 = __return_storage_ptr__;
  do {
    local_50[1] = (code *)0x0;
    local_50[0] = ctype_whitespace;
    local_38 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_invoke;
    local_40 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_manager;
    bVar4 = GetCharIf(this,&local_59,(function<bool_(char)> *)local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)((_Any_data *)local_50,(_Any_data *)local_50,__destroy_functor);
    }
    psVar7 = local_58;
  } while (bVar4);
  pbVar2 = (this->token_buffer).c.
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->token_buffer).c.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur == pbVar2) {
    iVar5 = std::istream::peek();
    psVar7 = local_58;
    if (iVar5 == -1) {
      (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
      local_58->_M_string_length = 0;
      (local_58->field_2)._M_local_buf[0] = '\0';
    }
    else {
      local_59 = (char)iVar5;
      pcVar6 = "(),&|=!<>+-*/%&|!~";
      do {
        cVar1 = *pcVar6;
        if (cVar1 == local_59) break;
        pcVar6 = pcVar6 + 1;
      } while (cVar1 != '\0');
      if (cVar1 == '\0') {
        ReadValue_abi_cxx11_(local_58,this);
      }
      else {
        ReadOperator_abi_cxx11_(local_58,this);
      }
    }
  }
  else {
    (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
    pcVar3 = (pbVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,pcVar3,pcVar3 + pbVar2->_M_string_length);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(&(this->token_buffer).c);
  }
  return psVar7;
}

Assistant:

std::string Lexer::ReadToken()
	{
		char c;

		while (this->GetCharIf(c, ctype_whitespace)) ; // no loop body

		if (!this->token_buffer.empty())
		{
			std::string token = this->token_buffer.front();
			this->token_buffer.pop();
			return token;
		}

		if (this->PeekChar(c))
		{
			if (ctype_op(c))
			{
				return this->ReadOperator();
			}
			else
			{
				return this->ReadValue();
			}
		}

		return {};
	}